

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

bool __thiscall
ByteCodeGenerator::EnsureSymbolModuleSlots(ByteCodeGenerator *this,Symbol *sym,FuncInfo *funcInfo)

{
  SourceTextModuleRecord *this_00;
  code *pcVar1;
  bool bVar2;
  PropertyId PVar3;
  uint uVar4;
  undefined4 *puVar5;
  ScriptContext *this_01;
  ModuleRecordBase *pMVar6;
  ModuleRecordBase **ppMVar7;
  PropertyId exportNameId;
  SourceTextModuleRecord *resolvedModuleRecord;
  ModuleNameRecord *moduleNameRecord;
  SourceTextModuleRecord *pSStack_40;
  PropertyId localImportNameId;
  SourceTextModuleRecord *moduleRecord;
  uint moduleSlotIndex;
  uint moduleIndex;
  JavascriptLibrary *library;
  FuncInfo *funcInfo_local;
  Symbol *sym_local;
  ByteCodeGenerator *this_local;
  
  library = (JavascriptLibrary *)funcInfo;
  funcInfo_local = (FuncInfo *)sym;
  sym_local = (Symbol *)this;
  bVar2 = Symbol::GetIsModuleExportStorage(sym);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0xf20,"(sym->GetIsModuleExportStorage())","sym->GetIsModuleExportStorage()")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  PVar3 = Symbol::GetModuleIndex((Symbol *)funcInfo_local);
  if ((PVar3 != -1) && (PVar3 = Symbol::GetScopeSlot((Symbol *)funcInfo_local), PVar3 != -1)) {
    return true;
  }
  this_01 = GetScriptContext(this);
  _moduleSlotIndex = Js::ScriptContext::GetLibrary(this_01);
  Js::JavascriptLibrary::EnsureModuleRecordList(_moduleSlotIndex);
  moduleRecord._4_4_ = GetModuleID(this);
  pSStack_40 = Js::JavascriptLibrary::GetModuleRecord(_moduleSlotIndex,moduleRecord._4_4_);
  bVar2 = Symbol::GetIsModuleImport((Symbol *)funcInfo_local);
  if (bVar2) {
    moduleNameRecord._4_4_ = Symbol::EnsurePosition((Symbol *)funcInfo_local,(FuncInfo *)library);
    resolvedModuleRecord = (SourceTextModuleRecord *)0x0;
    bVar2 = Js::SourceTextModuleRecord::ResolveImport
                      (pSStack_40,moduleNameRecord._4_4_,(ModuleNameRecord **)&resolvedModuleRecord)
    ;
    if (!bVar2) {
      return false;
    }
    if (resolvedModuleRecord == (SourceTextModuleRecord *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0xf36,"(moduleNameRecord != nullptr)","moduleNameRecord != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pMVar6 = Memory::WriteBarrierPtr<Js::ModuleRecordBase>::operator->
                       ((WriteBarrierPtr<Js::ModuleRecordBase> *)resolvedModuleRecord);
    uVar4 = (*(pMVar6->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0xd])();
    if ((uVar4 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0xf37,"(moduleNameRecord->module->IsSourceTextModuleRecord())",
                         "moduleNameRecord->module->IsSourceTextModuleRecord()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    ppMVar7 = Memory::PointerValue<Js::ModuleRecordBase>
                        ((WriteBarrierPtr<Js::ModuleRecordBase> *)resolvedModuleRecord);
    this_00 = (SourceTextModuleRecord *)*ppMVar7;
    moduleRecord._4_4_ = Js::SourceTextModuleRecord::GetModuleId(this_00);
    moduleRecord._0_4_ =
         Js::SourceTextModuleRecord::GetLocalExportSlotIndexByLocalName
                   (this_00,(resolvedModuleRecord->super_ModuleRecordBase).magicNumber);
  }
  else {
    PVar3 = Symbol::EnsurePosition((Symbol *)funcInfo_local,(FuncInfo *)library);
    moduleRecord._0_4_ =
         Js::SourceTextModuleRecord::GetLocalExportSlotIndexByLocalName(pSStack_40,PVar3);
  }
  Symbol::SetModuleIndex((Symbol *)funcInfo_local,moduleRecord._4_4_);
  Symbol::SetScopeSlot((Symbol *)funcInfo_local,(uint)moduleRecord);
  return true;
}

Assistant:

bool ByteCodeGenerator::EnsureSymbolModuleSlots(Symbol* sym, FuncInfo* funcInfo)
{
    Assert(sym->GetIsModuleExportStorage());

    if (sym->GetModuleIndex() != Js::Constants::NoProperty && sym->GetScopeSlot() != Js::Constants::NoProperty)
    {
        return true;
    }

    Js::JavascriptLibrary* library = this->GetScriptContext()->GetLibrary();
    library->EnsureModuleRecordList();
    uint moduleIndex = this->GetModuleID();
    uint moduleSlotIndex;
    Js::SourceTextModuleRecord* moduleRecord = library->GetModuleRecord(moduleIndex);

    if (sym->GetIsModuleImport())
    {
        Js::PropertyId localImportNameId = sym->EnsurePosition(funcInfo);
        Js::ModuleNameRecord* moduleNameRecord = nullptr;
        if (!moduleRecord->ResolveImport(localImportNameId, &moduleNameRecord))
        {
            return false;
        }

        AnalysisAssert(moduleNameRecord != nullptr);
        Assert(moduleNameRecord->module->IsSourceTextModuleRecord());
        Js::SourceTextModuleRecord* resolvedModuleRecord =
            (Js::SourceTextModuleRecord*)PointerValue(moduleNameRecord->module);

        moduleIndex = resolvedModuleRecord->GetModuleId();
        moduleSlotIndex = resolvedModuleRecord->GetLocalExportSlotIndexByLocalName(moduleNameRecord->bindingName);
    }
    else
    {
        Js::PropertyId exportNameId = sym->EnsurePosition(funcInfo);
        moduleSlotIndex = moduleRecord->GetLocalExportSlotIndexByLocalName(exportNameId);
    }

    sym->SetModuleIndex(moduleIndex);
    sym->SetScopeSlot(moduleSlotIndex);

    return true;
}